

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::parameterList_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  Token comma;
  Token param;
  Token local_1c0;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  bool bStack_cc;
  bool bStack_cb;
  char cStack_ca;
  undefined1 uStack_c9;
  double dStack_c8;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  bool bStack_5c;
  bool bStack_5b;
  char cStack_5a;
  undefined1 uStack_59;
  double dStack_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Tokenizer::getToken((Token *)local_110,this->tokenizer);
  if (cStack_ca != ')') {
    paVar1 = &local_1c0._name.field_2;
    do {
      local_1c0._name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,local_110._0_8_,(pointer)(local_110._0_8_ + local_110._8_8_));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_1c0._name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._name._M_dataplus._M_p,
                        local_1c0._name.field_2._M_allocated_capacity + 1);
      }
      Tokenizer::getToken(&local_1c0,this->tokenizer);
      bVar2 = true;
      if (local_1c0._symbol != ')') {
        if (local_1c0._symbol != ',') {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"Parser::parameterList","");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"Expected an , sign, instead got","");
          die(this,&local_130,&local_150,&local_1c0);
          Token::~Token((Token *)local_110);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(__return_storage_ptr__);
          _Unwind_Resume(extraout_RAX);
        }
        Tokenizer::getToken((Token *)local_a0,this->tokenizer);
        std::__cxx11::string::operator=((string *)local_110,(string *)local_a0);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_80);
        local_d0 = local_60;
        bStack_cf = bStack_5f;
        bStack_ce = bStack_5e;
        bStack_cd = bStack_5d;
        bStack_cc = bStack_5c;
        bStack_cb = bStack_5b;
        cStack_ca = cStack_5a;
        uStack_c9 = uStack_59;
        dStack_c8 = dStack_58;
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._string._M_dataplus._M_p != &local_1c0._string.field_2) {
        operator_delete(local_1c0._string._M_dataplus._M_p,
                        local_1c0._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._relOp._M_dataplus._M_p != &local_1c0._relOp.field_2) {
        operator_delete(local_1c0._relOp._M_dataplus._M_p,
                        local_1c0._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._name._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._name._M_dataplus._M_p,
                        local_1c0._name.field_2._M_allocated_capacity + 1);
      }
    } while (!bVar2 && cStack_ca != ')');
  }
  Tokenizer::ungetToken(this->tokenizer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>Parser::parameterList(){
    std::vector<std::string>params;
    Token param = tokenizer.getToken();
    while(!param.isCloseParen()){
        params.push_back(param.getName());
        Token comma = tokenizer.getToken();
        if(comma.isCloseParen()) break;
        if(!comma.isComma())
            die("Parser::parameterList", "Expected an , sign, instead got", comma);
        param = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return params;
}